

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.cpp
# Opt level: O2

array<cv::RotatedRect,_10UL> *
ellipses::compute_final_ellipses_by_linear_interpolation
          (array<cv::RotatedRect,_10UL> *__return_storage_ptr__,
          array<cv::RotatedRect,_3UL> *ellipses,size_t ignored_index)

{
  undefined1 auVar1 [16];
  double dVar2;
  float *pfVar3;
  long lVar4;
  size_t sVar5;
  double dVar6;
  double dVar9;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar14;
  undefined1 auVar13 [16];
  double dVar15;
  double dVar18;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar19;
  double dVar22;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  undefined4 uVar27;
  double dVar28;
  double dVar29;
  
  memset(__return_storage_ptr__,0,200);
  pfVar3 = &ellipses->_M_elems[0].angle;
  dVar6 = 0.0;
  dVar9 = 0.0;
  dVar10 = 0.0;
  dVar11 = 0.0;
  dVar12 = 0.0;
  dVar14 = 0.0;
  dVar15 = 0.0;
  dVar18 = 0.0;
  dVar19 = 0.0;
  dVar22 = 0.0;
  dVar23 = 0.0;
  dVar24 = 0.0;
  for (sVar5 = 0; sVar5 != 3; sVar5 = sVar5 + 1) {
    if (ignored_index != sVar5) {
      dVar25 = (double)(long)sVar5;
      dVar23 = dVar23 + (double)(long)(sVar5 * sVar5);
      dVar24 = dVar24 + dVar25;
      dVar11 = dVar11 + (double)*pfVar3;
      dVar28 = (double)(((RotatedRect *)(pfVar3 + -4))->center).x;
      dVar29 = (double)(((RotatedRect *)(pfVar3 + -4))->center).y;
      dVar26 = (double)(*(Size2f *)(pfVar3 + -2)).width;
      dVar2 = (double)(*(Size2f *)(pfVar3 + -2)).height;
      dVar10 = dVar10 + (double)*pfVar3 * dVar25;
      dVar19 = dVar19 + dVar26;
      dVar22 = dVar22 + dVar2;
      dVar15 = dVar15 + dVar28;
      dVar18 = dVar18 + dVar29;
      dVar12 = dVar12 + dVar26 * dVar25;
      dVar14 = dVar14 + dVar2 * dVar25;
      dVar6 = dVar6 + dVar25 * dVar28;
      dVar9 = dVar9 + dVar25 * dVar29;
    }
    pfVar3 = pfVar3 + 5;
  }
  dVar26 = (double)(int)(3 - (uint)(ignored_index < 3));
  dVar23 = dVar26 * dVar23 - dVar24 * dVar24;
  dVar10 = (dVar10 * dVar26 - dVar11 * dVar24) / dVar23;
  auVar7._0_8_ = dVar6 * dVar26 - dVar15 * dVar24;
  auVar7._8_8_ = dVar9 * dVar26 - dVar18 * dVar24;
  auVar13._0_8_ = dVar12 * dVar26 - dVar19 * dVar24;
  auVar13._8_8_ = dVar14 * dVar26 - dVar22 * dVar24;
  uVar27 = (undefined4)((ulong)dVar23 >> 0x20);
  auVar8._8_4_ = SUB84(dVar23,0);
  auVar8._0_8_ = dVar23;
  auVar8._12_4_ = uVar27;
  auVar13 = divpd(auVar13,auVar8);
  auVar21._8_4_ = SUB84(dVar23,0);
  auVar21._0_8_ = dVar23;
  auVar21._12_4_ = uVar27;
  auVar8 = divpd(auVar7,auVar21);
  auVar16._0_8_ = dVar15 - auVar8._0_8_ * dVar24;
  auVar16._8_8_ = dVar18 - auVar8._8_8_ * dVar24;
  auVar20._0_8_ = dVar19 - dVar24 * auVar13._0_8_;
  auVar20._8_8_ = dVar22 - dVar24 * auVar13._8_8_;
  auVar17._8_8_ = dVar26;
  auVar17._0_8_ = dVar26;
  auVar21 = divpd(auVar20,auVar17);
  auVar1._8_8_ = dVar26;
  auVar1._0_8_ = dVar26;
  auVar17 = divpd(auVar16,auVar1);
  pfVar3 = &__return_storage_ptr__->_M_elems[0].angle;
  for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
    dVar6 = (double)lVar4 * 0.5 + -0.5;
    (((RotatedRect *)(pfVar3 + -4))->center).x = (float)(auVar8._0_8_ * dVar6 + auVar17._0_8_);
    pfVar3[-3] = (float)(auVar8._8_8_ * dVar6 + auVar17._8_8_);
    ((Size2f *)(pfVar3 + -2))->width = (float)(dVar6 * auVar13._0_8_ + auVar21._0_8_);
    pfVar3[-1] = (float)(dVar6 * auVar13._8_8_ + auVar21._8_8_);
    *pfVar3 = (float)(dVar10 * dVar6 + (dVar11 - dVar10 * dVar24) / dVar26);
    pfVar3 = pfVar3 + 5;
  }
  return __return_storage_ptr__;
}

Assistant:

std::array<cv::RotatedRect, 10> compute_final_ellipses_by_linear_interpolation(
    const std::array<cv::RotatedRect, 3>& ellipses, std::size_t ignored_index)
{
    std::array<cv::RotatedRect, 10> result = {};

    auto sample_size = ellipses.size();
    if(ignored_index < ellipses.size())
        sample_size--;

    double x_sum, x_x_sum, height_sum, x_height_sum, width_sum, x_width_sum, angle_sum, x_angle_sum, centerx_sum,
        x_centerx_sum, centery_sum, x_centery_sum;
    x_sum = x_x_sum = height_sum = x_height_sum = width_sum = x_width_sum = angle_sum = x_angle_sum = centerx_sum
        = x_centerx_sum = centery_sum = x_centery_sum = 0;

    for(std::size_t i = 0; i < ellipses.size(); i++)
    {
        if(i != ignored_index)
        {
            x_sum += i;
            x_x_sum += i * i;

            height_sum += ellipses[i].size.height;
            x_height_sum += i * double(ellipses[i].size.height);

            width_sum += ellipses[i].size.width;
            x_width_sum += i * double(ellipses[i].size.width);

            angle_sum += ellipses[i].angle;
            x_angle_sum += i * double(ellipses[i].angle);

            centerx_sum += ellipses[i].center.x;
            x_centerx_sum += i * double(ellipses[i].center.x);
            centery_sum += ellipses[i].center.y;
            x_centery_sum += i * double(ellipses[i].center.y);
        }
    }

    double x_square = (sample_size * x_x_sum - x_sum * x_sum);

    double height_coef = (sample_size * x_height_sum - x_sum * height_sum) / x_square;
    double height_constant = (height_sum - height_coef * x_sum) / sample_size;

    double width_coef = (sample_size * x_width_sum - x_sum * width_sum) / x_square;
    double width_constant = (width_sum - width_coef * x_sum) / sample_size;

    double angle_coef = (sample_size * x_angle_sum - x_sum * angle_sum) / x_square;
    double angle_constant = (angle_sum - angle_coef * x_sum) / sample_size;

    double centerx_coef = (sample_size * x_centerx_sum - x_sum * centerx_sum) / x_square;
    double centerx_constant = (centerx_sum - centerx_coef * x_sum) / sample_size;
    double centery_coef = (sample_size * x_centery_sum - x_sum * centery_sum) / x_square;
    double centery_constant = (centery_sum - centery_coef * x_sum) / sample_size;

    for(std::size_t i = 0; i < result.size(); i++)
    {
        auto x = i * 0.5 - 0.5;
        cv::Point2f center(float(centerx_coef * x + centerx_constant), float(centery_coef * x + centery_constant));
        cv::Size2f size(float(width_coef * x + width_constant), float(height_coef * x + height_constant));
        float angle = float(angle_coef * x + angle_constant);
        result[i] = cv::RotatedRect(center, size, angle);
    }

    return result;
}